

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O0

ptime_t get_time(uint card)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  ptime_t high1;
  ptime_t high2;
  ptime_t low;
  uint card_local;
  
  uVar1 = nva_rd32(card,0x9410);
  high1 = (ulong)uVar1;
  do {
    uVar1 = nva_rd32(card,0x9400);
    uVar2 = nva_rd32(card,0x9410);
    bVar3 = high1 != uVar2;
    high1 = (ulong)uVar2;
  } while (bVar3);
  return CONCAT44(uVar2,uVar1) >> 5;
}

Assistant:

ptime_t get_time(unsigned int card)
{
	ptime_t low;

	/* From kmmio dumps on nv28 this looks like how the blob does this.
	* It reads the high dword twice, before and after.
	* The only explanation seems to be that the 64-bit timer counter
	* advances between high and low dword reads and may corrupt the
	* result. Not confirmed.
	*/
	ptime_t high2 = nva_rd32(card, NV04_PTIMER_TIME_1);
	ptime_t high1;
	do {
		high1 = high2;
		low = nva_rd32(card, NV04_PTIMER_TIME_0);
		high2 = nva_rd32(card, NV04_PTIMER_TIME_1);
	} while (high1 != high2);
	return ((((ptime_t)high2) << 32) | (ptime_t)low) >> 5;
}